

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

string * httplib::detail::encode_url(string *__return_storage_ptr__,string *s)

{
  byte bVar1;
  uint uVar2;
  size_t i;
  long lVar3;
  char hex [4];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  lVar3 = 0;
  do {
    bVar1 = (s->_M_dataplus)._M_p[lVar3];
    if ((((bVar1 == 10) || (bVar1 == 0xd)) || (bVar1 == 0x20)) ||
       (((bVar1 == 0x27 || (bVar1 == 0x2b)) ||
        ((bVar1 == 0x2c || (uVar2 = (uint)bVar1, uVar2 == 0x3b)))))) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      if (uVar2 == 0) {
        return __return_storage_ptr__;
      }
      if ((char)bVar1 < '\0') {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        snprintf(hex,3,"%02X",(ulong)uVar2);
        std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)hex);
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

inline std::string encode_url(const std::string& s) {
            std::string result;
            result.reserve(s.size());

            for (size_t i = 0; s[i]; i++) {
                switch (s[i]) {
                    case ' ': result += "%20"; break;
                    case '+': result += "%2B"; break;
                    case '\r': result += "%0D"; break;
                    case '\n': result += "%0A"; break;
                    case '\'': result += "%27"; break;
                    case ',': result += "%2C"; break;
                        // case ':': result += "%3A"; break; // ok? probably...
                    case ';': result += "%3B"; break;
                    default:
                        auto c = static_cast<uint8_t>(s[i]);
                        if (c >= 0x80) {
                            result += '%';
                            char hex[4];
                            auto len = snprintf(hex, sizeof(hex) - 1, "%02X", c);
                            assert(len == 2);
                            result.append(hex, static_cast<size_t>(len));
                        } else {
                            result += s[i];
                        }
                        break;
                }
            }

            return result;
        }